

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O0

REF_STATUS
ref_facelift_displacement_at
          (REF_FACELIFT ref_facelift,REF_INT type,REF_INT id,REF_DBL *params,REF_DBL *displacement)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL clip [3];
  REF_DBL local_d8;
  REF_DBL bary [3];
  REF_INT local_b8;
  REF_INT local_b4;
  REF_INT nodes [27];
  int local_40;
  int local_3c;
  REF_INT cell;
  REF_INT geom;
  REF_GEOM ref_geom;
  REF_DBL *displacement_local;
  REF_DBL *params_local;
  REF_INT id_local;
  REF_INT type_local;
  REF_FACELIFT ref_facelift_local;
  
  _cell = ref_facelift->grid->geom;
  *displacement = 0.0;
  displacement[1] = 0.0;
  displacement[2] = 0.0;
  ref_geom = (REF_GEOM)displacement;
  displacement_local = params;
  params_local._0_4_ = id;
  params_local._4_4_ = type;
  _id_local = ref_facelift;
  if (ref_facelift->displacement == (REF_DBL *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x280,"ref_facelift_displacement_at","requires indirect facelift");
    return 1;
  }
  if (type == 1) {
    uVar1 = ref_facelift_enclosing(ref_facelift,1,id,params,&local_40,&local_d8);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x284,"ref_facelift_displacement_at",(ulong)uVar1,"enclose");
      return uVar1;
    }
    if (local_40 == -1) {
      return 0;
    }
    uVar1 = ref_node_clip_bary2(&local_d8,(REF_DBL *)&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x286,"ref_facelift_displacement_at",(ulong)uVar1,"clip edge bary");
      return uVar1;
    }
    uVar1 = ref_cell_nodes(_id_local->edg_cell,local_40,&local_b8);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x287,"ref_facelift_displacement_at",(ulong)uVar1,"nodes");
      return uVar1;
    }
    uVar1 = ref_geom_find(_cell,local_b8,1,(REF_INT)params_local,&local_3c);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x289,"ref_facelift_displacement_at",(ulong)uVar1,"find 0");
      return uVar1;
    }
    *(double *)ref_geom =
         _ref_private_macro_code_rss_1 * _id_local->displacement[local_3c * 3] + *(double *)ref_geom
    ;
    *(double *)&ref_geom->blank =
         _ref_private_macro_code_rss_1 * _id_local->displacement[local_3c * 3 + 1] +
         *(double *)&ref_geom->blank;
    ref_geom->descr =
         (REF_INT *)
         (_ref_private_macro_code_rss_1 * _id_local->displacement[local_3c * 3 + 2] +
         (double)ref_geom->descr);
    uVar1 = ref_geom_find(_cell,local_b4,1,(REF_INT)params_local,&local_3c);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x291,"ref_facelift_displacement_at",(ulong)uVar1,"find 1");
      return uVar1;
    }
    *(double *)ref_geom = clip[0] * _id_local->displacement[local_3c * 3] + *(double *)ref_geom;
    *(double *)&ref_geom->blank =
         clip[0] * _id_local->displacement[local_3c * 3 + 1] + *(double *)&ref_geom->blank;
    ref_geom->descr =
         (REF_INT *)(clip[0] * _id_local->displacement[local_3c * 3 + 2] + (double)ref_geom->descr);
  }
  if (params_local._4_4_ == 2) {
    uVar1 = ref_facelift_enclosing
                      (_id_local,2,(REF_INT)params_local,displacement_local,&local_40,&local_d8);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x29b,"ref_facelift_displacement_at",(ulong)uVar1,"enclose");
      return uVar1;
    }
    if (local_40 == -1) {
      return 0;
    }
    uVar1 = ref_node_clip_bary3(&local_d8,(REF_DBL *)&ref_private_macro_code_rss_1);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x29d,"ref_facelift_displacement_at",(ulong)uVar1,"clip face bary");
      return uVar1;
    }
    uVar1 = ref_cell_nodes(_id_local->tri_cell,local_40,&local_b8);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x29e,"ref_facelift_displacement_at",(ulong)uVar1,"nodes");
      return uVar1;
    }
    uVar1 = ref_geom_find(_cell,local_b8,2,(REF_INT)params_local,&local_3c);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x2a0,"ref_facelift_displacement_at",(ulong)uVar1,"find 0");
      return uVar1;
    }
    *(double *)ref_geom =
         _ref_private_macro_code_rss_1 * _id_local->displacement[local_3c * 3] + *(double *)ref_geom
    ;
    *(double *)&ref_geom->blank =
         _ref_private_macro_code_rss_1 * _id_local->displacement[local_3c * 3 + 1] +
         *(double *)&ref_geom->blank;
    ref_geom->descr =
         (REF_INT *)
         (_ref_private_macro_code_rss_1 * _id_local->displacement[local_3c * 3 + 2] +
         (double)ref_geom->descr);
    uVar1 = ref_geom_find(_cell,local_b4,2,(REF_INT)params_local,&local_3c);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x2a8,"ref_facelift_displacement_at",(ulong)uVar1,"find 1");
      return uVar1;
    }
    *(double *)ref_geom = clip[0] * _id_local->displacement[local_3c * 3] + *(double *)ref_geom;
    *(double *)&ref_geom->blank =
         clip[0] * _id_local->displacement[local_3c * 3 + 1] + *(double *)&ref_geom->blank;
    ref_geom->descr =
         (REF_INT *)(clip[0] * _id_local->displacement[local_3c * 3 + 2] + (double)ref_geom->descr);
    uVar1 = ref_geom_find(_cell,nodes[0],2,(REF_INT)params_local,&local_3c);
    if (uVar1 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x2b0,"ref_facelift_displacement_at",(ulong)uVar1,"find 2");
      return uVar1;
    }
    *(double *)ref_geom = clip[1] * _id_local->displacement[local_3c * 3] + *(double *)ref_geom;
    *(double *)&ref_geom->blank =
         clip[1] * _id_local->displacement[local_3c * 3 + 1] + *(double *)&ref_geom->blank;
    ref_geom->descr =
         (REF_INT *)(clip[1] * _id_local->displacement[local_3c * 3 + 2] + (double)ref_geom->descr);
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_facelift_displacement_at(
    REF_FACELIFT ref_facelift, REF_INT type, REF_INT id, REF_DBL *params,
    REF_DBL *displacement) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_INT geom, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL bary[3], clip[3];
  displacement[0] = 0.0;
  displacement[1] = 0.0;
  displacement[2] = 0.0;

  RAS(!ref_facelift_direct(ref_facelift), "requires indirect facelift");

  if (REF_GEOM_EDGE == type) {
    RSS(ref_facelift_enclosing(ref_facelift, type, id, params, &cell, bary),
        "enclose");
    if (REF_EMPTY == cell) return REF_SUCCESS;
    RSS(ref_node_clip_bary2(bary, clip), "clip edge bary");
    RSS(ref_cell_nodes(ref_facelift_edg(ref_facelift), cell, nodes), "nodes");

    RSS(ref_geom_find(ref_geom, nodes[0], REF_GEOM_EDGE, id, &geom), "find 0");
    displacement[0] +=
        clip[0] * ref_facelift_displacement(ref_facelift, 0, geom);
    displacement[1] +=
        clip[0] * ref_facelift_displacement(ref_facelift, 1, geom);
    displacement[2] +=
        clip[0] * ref_facelift_displacement(ref_facelift, 2, geom);

    RSS(ref_geom_find(ref_geom, nodes[1], REF_GEOM_EDGE, id, &geom), "find 1");
    displacement[0] +=
        clip[1] * ref_facelift_displacement(ref_facelift, 0, geom);
    displacement[1] +=
        clip[1] * ref_facelift_displacement(ref_facelift, 1, geom);
    displacement[2] +=
        clip[1] * ref_facelift_displacement(ref_facelift, 2, geom);
  }
  if (REF_GEOM_FACE == type) {
    RSS(ref_facelift_enclosing(ref_facelift, type, id, params, &cell, bary),
        "enclose");
    if (REF_EMPTY == cell) return REF_SUCCESS;
    RSS(ref_node_clip_bary3(bary, clip), "clip face bary");
    RSS(ref_cell_nodes(ref_facelift_tri(ref_facelift), cell, nodes), "nodes");

    RSS(ref_geom_find(ref_geom, nodes[0], REF_GEOM_FACE, id, &geom), "find 0");
    displacement[0] +=
        clip[0] * ref_facelift_displacement(ref_facelift, 0, geom);
    displacement[1] +=
        clip[0] * ref_facelift_displacement(ref_facelift, 1, geom);
    displacement[2] +=
        clip[0] * ref_facelift_displacement(ref_facelift, 2, geom);

    RSS(ref_geom_find(ref_geom, nodes[1], REF_GEOM_FACE, id, &geom), "find 1");
    displacement[0] +=
        clip[1] * ref_facelift_displacement(ref_facelift, 0, geom);
    displacement[1] +=
        clip[1] * ref_facelift_displacement(ref_facelift, 1, geom);
    displacement[2] +=
        clip[1] * ref_facelift_displacement(ref_facelift, 2, geom);

    RSS(ref_geom_find(ref_geom, nodes[2], REF_GEOM_FACE, id, &geom), "find 2");
    displacement[0] +=
        clip[2] * ref_facelift_displacement(ref_facelift, 0, geom);
    displacement[1] +=
        clip[2] * ref_facelift_displacement(ref_facelift, 1, geom);
    displacement[2] +=
        clip[2] * ref_facelift_displacement(ref_facelift, 2, geom);
  }

  return REF_SUCCESS;
}